

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_unsigned_int>::
IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_>::IteratorImpl
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *this,
          ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_unsigned_int>_>
          *base,tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<unsigned_int>_>
                *generators,bool is_end)

{
  ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_unsigned_int>_>
  *in_RSI;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *in_RDI;
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<unsigned_int>_>
  *in_stack_ffffffffffffff68;
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<unsigned_int>_>
  *in_stack_ffffffffffffff70;
  ParamGenerator<const_libaom_test::CodecFactory_*> *in_stack_ffffffffffffff78;
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<unsigned_int>_>
  *in_stack_ffffffffffffff80;
  
  ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_unsigned_int>_>
  ::ParamIteratorInterface
            (&in_RDI->
              super_ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_unsigned_int>_>
            );
  (in_RDI->
  super_ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_unsigned_int>_>
  )._vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_01f6df08;
  in_RDI->base_ = in_RSI;
  std::
  get<0ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<unsigned_int>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<unsigned_int>_>
              *)0x7ac90e);
  ParamGenerator<const_libaom_test::CodecFactory_*>::begin(in_stack_ffffffffffffff78);
  std::
  get<1ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<unsigned_int>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<unsigned_int>_>
              *)0x7ac92a);
  ParamGenerator<libaom_test::TestMode>::begin
            ((ParamGenerator<libaom_test::TestMode> *)in_stack_ffffffffffffff78);
  std::
  get<2ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<unsigned_int>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<unsigned_int>_>
              *)0x7ac946);
  ParamGenerator<unsigned_int>::begin((ParamGenerator<unsigned_int> *)in_stack_ffffffffffffff78);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<unsigned_int>_>
  ::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<unsigned_int>,_true,_true>
            (in_stack_ffffffffffffff80,
             (ParamIterator<const_libaom_test::CodecFactory_*> *)in_stack_ffffffffffffff78,
             (ParamIterator<libaom_test::TestMode> *)in_stack_ffffffffffffff70,
             (ParamIterator<unsigned_int> *)in_stack_ffffffffffffff68);
  ParamIterator<unsigned_int>::~ParamIterator((ParamIterator<unsigned_int> *)0x7ac97a);
  ParamIterator<libaom_test::TestMode>::~ParamIterator
            ((ParamIterator<libaom_test::TestMode> *)0x7ac984);
  ParamIterator<const_libaom_test::CodecFactory_*>::~ParamIterator
            ((ParamIterator<const_libaom_test::CodecFactory_*> *)0x7ac98e);
  std::
  get<0ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<unsigned_int>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<unsigned_int>_>
              *)0x7ac9a9);
  ParamGenerator<const_libaom_test::CodecFactory_*>::end(in_stack_ffffffffffffff78);
  std::
  get<1ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<unsigned_int>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<unsigned_int>_>
              *)0x7ac9c5);
  ParamGenerator<libaom_test::TestMode>::end
            ((ParamGenerator<libaom_test::TestMode> *)in_stack_ffffffffffffff78);
  std::
  get<2ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<unsigned_int>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<unsigned_int>_>
              *)0x7ac9e1);
  ParamGenerator<unsigned_int>::end((ParamGenerator<unsigned_int> *)in_stack_ffffffffffffff78);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<unsigned_int>_>
  ::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<unsigned_int>,_true,_true>
            (in_stack_ffffffffffffff80,
             (ParamIterator<const_libaom_test::CodecFactory_*> *)in_stack_ffffffffffffff78,
             (ParamIterator<libaom_test::TestMode> *)in_stack_ffffffffffffff70,
             (ParamIterator<unsigned_int> *)in_stack_ffffffffffffff68);
  ParamIterator<unsigned_int>::~ParamIterator((ParamIterator<unsigned_int> *)0x7aca15);
  ParamIterator<libaom_test::TestMode>::~ParamIterator
            ((ParamIterator<libaom_test::TestMode> *)0x7aca1f);
  ParamIterator<const_libaom_test::CodecFactory_*>::~ParamIterator
            ((ParamIterator<const_libaom_test::CodecFactory_*> *)0x7aca29);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<unsigned_int>_>
  ::tuple(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::
  shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_unsigned_int>_>::
  shared_ptr((shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_unsigned_int>_>
              *)0x7aca80);
  ComputeCurrentValue(in_RDI);
  return;
}

Assistant:

IteratorImpl(const ParamGeneratorInterface<ParamType>* base,
                 const std::tuple<ParamGenerator<T>...>& generators,
                 bool is_end)
        : base_(base),
          begin_(std::get<I>(generators).begin()...),
          end_(std::get<I>(generators).end()...),
          current_(is_end ? end_ : begin_) {
      ComputeCurrentValue();
    }